

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_portable_predictor.h
# Opt level: O3

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::ComputePredictedValue<false>
          (MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,CornerIndex corner_id,int *data,int data_id)

{
  int entry_id;
  int iVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  pointer pIVar4;
  pointer piVar5;
  _Bit_type *p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int i;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  ulong uVar20;
  Scalar_conflict ret_1;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  Vec3 pn;
  Self ret_5;
  Self ret_4;
  Vec3 x_pos;
  Vec3 cn;
  Vec3 next_pos;
  Vec3 tip_pos;
  Vec3 prev_pos;
  ulong local_128 [4];
  long local_108 [4];
  long local_e8;
  long local_e0;
  long local_d8 [4];
  long local_b8 [4];
  long local_98 [4];
  VectorD<long,_3> local_78;
  VectorD<long,_3> local_60;
  VectorD<long,_3> local_48;
  
  if (corner_id.value_ == 0xffffffff) {
    uVar10 = 0xffffffff;
    uVar17 = 0xffffffff;
  }
  else {
    uVar10 = corner_id.value_ - 2;
    if (0x55555555 < corner_id.value_ * -0x55555555 + 0xaaaaaaab) {
      uVar10 = corner_id.value_ + 1;
    }
    if (corner_id.value_ * -0x55555555 < 0x55555556) {
      uVar17 = corner_id.value_ + 2;
    }
    else {
      uVar17 = corner_id.value_ - 1;
    }
  }
  pvVar3 = (this->mesh_data_).vertex_to_data_map_;
  pIVar4 = (((this->mesh_data_).corner_table_)->corner_to_vertex_map_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (ulong)(int)pIVar4[uVar10].value_;
  piVar5 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar16 = (long)(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
  uVar18 = uVar11;
  if ((uVar16 <= uVar11) || (uVar18 = (ulong)(int)pIVar4[uVar17].value_, uVar16 <= uVar18)) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar18);
  }
  iVar22 = piVar5[uVar11];
  entry_id = piVar5[uVar18];
  if ((entry_id < data_id) && (iVar22 < data_id)) {
    uVar18 = (ulong)data[(long)iVar22 * 2];
    iVar1 = data[(long)entry_id * 2];
    iVar2 = data[entry_id * 2 + 1];
    if (iVar2 == data[iVar22 * 2 + 1] && iVar1 == data[(long)iVar22 * 2]) {
      this->predicted_value_[0] = iVar1;
      this->predicted_value_[1] = iVar2;
      return true;
    }
    local_108[3] = (long)data[iVar22 * 2 + 1];
    local_e8 = (long)iVar1;
    local_e0 = (long)iVar2;
    GetPositionForEntryId(&local_60,this,data_id);
    GetPositionForEntryId(&local_78,this,iVar22);
    GetPositionForEntryId(&local_48,this,entry_id);
    local_128[0] = 0;
    local_128[1] = 0;
    local_128[2] = 0;
    lVar12 = 0;
    do {
      local_128[lVar12] = local_48.v_._M_elems[lVar12] - local_78.v_._M_elems[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar12 = 0;
    uVar11 = 0;
    do {
      uVar11 = uVar11 + local_128[lVar12] * local_128[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    if (uVar11 != 0) {
      local_98[0] = 0;
      local_98[1] = 0;
      local_98[2] = 0;
      lVar12 = 0;
      do {
        local_98[lVar12] = local_60.v_._M_elems[lVar12] - local_78.v_._M_elems[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar12 = 0;
      lVar14 = 0;
      do {
        lVar14 = lVar14 + local_98[lVar12] * local_128[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      uVar16 = -uVar18;
      if (0 < (long)uVar18) {
        uVar16 = uVar18;
      }
      uVar21 = -local_108[3];
      if (0 < local_108[3]) {
        uVar21 = local_108[3];
      }
      if (uVar21 < uVar16) {
        uVar21 = uVar16;
      }
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar11;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar7,0) < uVar21) {
        return false;
      }
      uVar21 = local_e8 - uVar18;
      uVar23 = local_e0 - local_108[3];
      uVar16 = -uVar21;
      if (0 < (long)uVar21) {
        uVar16 = uVar21;
      }
      uVar20 = -uVar23;
      if (0 < (long)uVar23) {
        uVar20 = uVar23;
      }
      if (uVar20 < uVar16) {
        uVar20 = uVar16;
      }
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar20;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar8,0) < lVar14) {
        return false;
      }
      uVar16 = -local_128[0];
      if (0 < (long)local_128[0]) {
        uVar16 = local_128[0];
      }
      uVar20 = -local_128[1];
      if (0 < (long)local_128[1]) {
        uVar20 = local_128[1];
      }
      uVar13 = -local_128[2];
      if (0 < (long)local_128[2]) {
        uVar13 = local_128[2];
      }
      if (uVar20 < uVar16) {
        uVar20 = uVar16;
      }
      if (uVar20 <= uVar13) {
        uVar20 = uVar13;
      }
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar20;
      if (lVar14 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar9,0)) {
        local_d8[0] = 0;
        local_d8[1] = 0;
        local_d8[2] = 0;
        lVar12 = 0;
        do {
          local_d8[lVar12] = local_128[lVar12] * lVar14;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_108[0] = 0;
        local_108[1] = 0;
        local_108[2] = 0;
        lVar12 = 0;
        do {
          local_108[lVar12] = local_d8[lVar12] / (long)uVar11;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_b8[0] = 0;
        local_b8[1] = 0;
        local_b8[2] = 0;
        lVar12 = 0;
        do {
          local_b8[lVar12] = local_108[lVar12] + local_78.v_._M_elems[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_108[0] = 0;
        local_108[1] = 0;
        local_108[2] = 0;
        lVar12 = 0;
        do {
          local_108[lVar12] = local_60.v_._M_elems[lVar12] - local_b8[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar12 = 0;
        lVar15 = 0;
        do {
          lVar15 = lVar15 + local_108[lVar12] * local_108[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        uVar16 = lVar15 * uVar11;
        if (uVar16 == 0) {
          uVar20 = 0;
        }
        else {
          uVar20 = uVar16;
          if (uVar16 != 1) {
            uVar20 = 1;
            uVar13 = uVar16;
            do {
              uVar20 = uVar20 * 2;
              bVar19 = 7 < uVar13;
              uVar13 = uVar13 >> 2;
            } while (bVar19);
          }
          do {
            uVar20 = uVar16 / uVar20 + uVar20 >> 1;
          } while (uVar16 <= uVar20 * uVar20 && uVar20 * uVar20 - uVar16 != 0);
        }
        p_Var6 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
        uVar10 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
        bVar24 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != p_Var6;
        bVar19 = uVar10 != 0 || bVar24;
        if (uVar10 != 0 || bVar24) {
          lVar12 = uVar21 * uVar20;
          uVar16 = (ulong)uVar10 - 1;
          uVar13 = (ulong)uVar10 + 0x3e;
          if (-1 < (long)uVar16) {
            uVar13 = uVar16;
          }
          uVar13 = p_Var6[((long)uVar13 >> 6) +
                          ((ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) - 1)];
          (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = uVar10 - 1;
          if (uVar10 == 0) {
            (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0x3f;
            (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var6 + -1;
          }
          lVar15 = -(uVar23 * uVar20);
          if ((1L << ((byte)uVar16 & 0x3f) & uVar13) != 0) {
            lVar15 = uVar23 * uVar20;
            lVar12 = -lVar12;
          }
          this->predicted_value_[0] =
               (int)((long)(uVar21 * lVar14 + uVar18 * uVar11 + lVar15) / (long)uVar11);
          this->predicted_value_[1] =
               (int)((long)(uVar23 * lVar14 + local_108[3] * uVar11 + lVar12) / (long)uVar11);
          return bVar19;
        }
        return bVar19;
      }
      return false;
    }
  }
  if (iVar22 < data_id) {
    iVar22 = iVar22 * 2;
  }
  else {
    if (data_id < 1) {
      this->predicted_value_[0] = 0;
      this->predicted_value_[1] = 0;
      return true;
    }
    iVar22 = data_id * 2 + -2;
  }
  this->predicted_value_[0] = data[iVar22];
  this->predicted_value_[1] = data[(long)iVar22 + 1];
  return true;
}

Assistant:

bool MeshPredictionSchemeTexCoordsPortablePredictor<
    DataTypeT, MeshDataT>::ComputePredictedValue(CornerIndex corner_id,
                                                 const DataTypeT *data,
                                                 int data_id) {
  // Compute the predicted UV coordinate from the positions on all corners
  // of the processed triangle. For the best prediction, the UV coordinates
  // on the next/previous corners need to be already encoded/decoded.
  const CornerIndex next_corner_id = mesh_data_.corner_table()->Next(corner_id);
  const CornerIndex prev_corner_id =
      mesh_data_.corner_table()->Previous(corner_id);
  // Get the encoded data ids from the next and previous corners.
  // The data id is the encoding order of the UV coordinates.
  int next_data_id, prev_data_id;

  int next_vert_id, prev_vert_id;
  next_vert_id = mesh_data_.corner_table()->Vertex(next_corner_id).value();
  prev_vert_id = mesh_data_.corner_table()->Vertex(prev_corner_id).value();

  next_data_id = mesh_data_.vertex_to_data_map()->at(next_vert_id);
  prev_data_id = mesh_data_.vertex_to_data_map()->at(prev_vert_id);

  typedef VectorD<int64_t, 2> Vec2;
  typedef VectorD<int64_t, 3> Vec3;
  typedef VectorD<uint64_t, 2> Vec2u;

  if (prev_data_id < data_id && next_data_id < data_id) {
    // Both other corners have available UV coordinates for prediction.
    const Vec2 n_uv = GetTexCoordForEntryId(next_data_id, data);
    const Vec2 p_uv = GetTexCoordForEntryId(prev_data_id, data);
    if (p_uv == n_uv) {
      // We cannot do a reliable prediction on degenerated UV triangles.
      predicted_value_[0] = p_uv[0];
      predicted_value_[1] = p_uv[1];
      return true;
    }

    // Get positions at all corners.
    const Vec3 tip_pos = GetPositionForEntryId(data_id);
    const Vec3 next_pos = GetPositionForEntryId(next_data_id);
    const Vec3 prev_pos = GetPositionForEntryId(prev_data_id);
    // We use the positions of the above triangle to predict the texture
    // coordinate on the tip corner C.
    // To convert the triangle into the UV coordinate system we first compute
    // position X on the vector |prev_pos - next_pos| that is the projection of
    // point C onto vector |prev_pos - next_pos|:
    //
    //              C
    //             /.  \
    //            / .     \
    //           /  .        \
    //          N---X----------P
    //
    // Where next_pos is point (N), prev_pos is point (P) and tip_pos is the
    // position of predicted coordinate (C).
    //
    const Vec3 pn = prev_pos - next_pos;
    const uint64_t pn_norm2_squared = pn.SquaredNorm();
    if (pn_norm2_squared != 0) {
      // Compute the projection of C onto PN by computing dot product of CN with
      // PN and normalizing it by length of PN. This gives us a factor |s| where
      // |s = PN.Dot(CN) / PN.SquaredNorm2()|. This factor can be used to
      // compute X in UV space |X_UV| as |X_UV = N_UV + s * PN_UV|.
      const Vec3 cn = tip_pos - next_pos;
      const int64_t cn_dot_pn = pn.Dot(cn);

      const Vec2 pn_uv = p_uv - n_uv;
      // Because we perform all computations with integers, we don't explicitly
      // compute the normalized factor |s|, but rather we perform all operations
      // over UV vectors in a non-normalized coordinate system scaled with a
      // scaling factor |pn_norm2_squared|:
      //
      //      x_uv = X_UV * PN.Norm2Squared()
      //
      const int64_t n_uv_absmax_element =
          std::max(std::abs(n_uv[0]), std::abs(n_uv[1]));
      if (n_uv_absmax_element >
          std::numeric_limits<int64_t>::max() / pn_norm2_squared) {
        // Return false if the below multiplication would overflow.
        return false;
      }
      const int64_t pn_uv_absmax_element =
          std::max(std::abs(pn_uv[0]), std::abs(pn_uv[1]));
      if (cn_dot_pn >
          std::numeric_limits<int64_t>::max() / pn_uv_absmax_element) {
        // Return false if squared length calculation would overflow.
        return false;
      }
      const Vec2 x_uv = n_uv * pn_norm2_squared + (cn_dot_pn * pn_uv);
      const int64_t pn_absmax_element =
          std::max(std::max(std::abs(pn[0]), std::abs(pn[1])), std::abs(pn[2]));
      if (cn_dot_pn > std::numeric_limits<int64_t>::max() / pn_absmax_element) {
        // Return false if squared length calculation would overflow.
        return false;
      }

      // Compute squared length of vector CX in position coordinate system:
      const Vec3 x_pos = next_pos + (cn_dot_pn * pn) / pn_norm2_squared;
      const uint64_t cx_norm2_squared = (tip_pos - x_pos).SquaredNorm();

      // Compute vector CX_UV in the uv space by rotating vector PN_UV by 90
      // degrees and scaling it with factor CX.Norm2() / PN.Norm2():
      //
      //     CX_UV = (CX.Norm2() / PN.Norm2()) * Rot(PN_UV)
      //
      // To preserve precision, we perform all operations in scaled space as
      // explained above, so we want the final vector to be:
      //
      //     cx_uv = CX_UV * PN.Norm2Squared()
      //
      // We can then rewrite the formula as:
      //
      //     cx_uv = CX.Norm2() * PN.Norm2() * Rot(PN_UV)
      //
      Vec2 cx_uv(pn_uv[1], -pn_uv[0]);  // Rotated PN_UV.
      // Compute CX.Norm2() * PN.Norm2()
      const uint64_t norm_squared =
          IntSqrt(cx_norm2_squared * pn_norm2_squared);
      // Final cx_uv in the scaled coordinate space.
      cx_uv = cx_uv * norm_squared;

      // Predicted uv coordinate is then computed by either adding or
      // subtracting CX_UV to/from X_UV.
      Vec2 predicted_uv;
      if (is_encoder_t) {
        // When encoding, compute both possible vectors and determine which one
        // results in a better prediction.
        // Both vectors need to be transformed back from the scaled space to
        // the real UV coordinate space.
        const Vec2 predicted_uv_0((x_uv + cx_uv) / pn_norm2_squared);
        const Vec2 predicted_uv_1((x_uv - cx_uv) / pn_norm2_squared);
        const Vec2 c_uv = GetTexCoordForEntryId(data_id, data);
        if ((c_uv - predicted_uv_0).SquaredNorm() <
            (c_uv - predicted_uv_1).SquaredNorm()) {
          predicted_uv = predicted_uv_0;
          orientations_.push_back(true);
        } else {
          predicted_uv = predicted_uv_1;
          orientations_.push_back(false);
        }
      } else {
        // When decoding the data, we already know which orientation to use.
        if (orientations_.empty()) {
          return false;
        }
        const bool orientation = orientations_.back();
        orientations_.pop_back();
        // Perform operations in unsigned type to avoid signed integer overflow.
        // Note that the result will be the same (for non-overflowing values).
        if (orientation) {
          predicted_uv = Vec2(Vec2u(x_uv) + Vec2u(cx_uv)) / pn_norm2_squared;
        } else {
          predicted_uv = Vec2(Vec2u(x_uv) - Vec2u(cx_uv)) / pn_norm2_squared;
        }
      }
      predicted_value_[0] = static_cast<int>(predicted_uv[0]);
      predicted_value_[1] = static_cast<int>(predicted_uv[1]);
      return true;
    }
  }
  // Else we don't have available textures on both corners or the position data
  // is invalid. For such cases we can't use positions for predicting the uv
  // value and we resort to delta coding.
  int data_offset = 0;
  if (prev_data_id < data_id) {
    // Use the value on the previous corner as the prediction.
    data_offset = prev_data_id * kNumComponents;
  }
  if (next_data_id < data_id) {
    // Use the value on the next corner as the prediction.
    data_offset = next_data_id * kNumComponents;
  } else {
    // None of the other corners have a valid value. Use the last encoded value
    // as the prediction if possible.
    if (data_id > 0) {
      data_offset = (data_id - 1) * kNumComponents;
    } else {
      // We are encoding the first value. Predict 0.
      for (int i = 0; i < kNumComponents; ++i) {
        predicted_value_[i] = 0;
      }
      return true;
    }
  }
  for (int i = 0; i < kNumComponents; ++i) {
    predicted_value_[i] = data[data_offset + i];
  }
  return true;
}